

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

uint32 __thiscall Js::DiagScopeVariablesWalker::GetChildrenCount(DiagScopeVariablesWalker *this)

{
  RecyclableArrayWalker *this_00;
  DiagStackFrame *pDVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  int offset;
  int iVar6;
  RegSlot RVar7;
  int iVar8;
  undefined4 *puVar9;
  undefined4 extraout_var;
  FunctionBody *this_01;
  ScopeObjectChain *pSVar10;
  undefined4 extraout_var_00;
  ArenaAllocator *alloc;
  List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar11;
  Type *pTVar12;
  IDiagObjectModelWalkerBase *pIVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RecyclableObjectWalker *this_02;
  undefined4 extraout_var_03;
  undefined **ppuVar14;
  _func_int **pp_Var15;
  undefined **local_58;
  
  if (this->scopeIsInitialized == false) {
    if ((this->super_VariableWalkerBase).pFrame == (DiagStackFrame *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x3ac,"(pFrame)","pFrame");
      if (!bVar4) {
LAB_008bf3b7:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    iVar5 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[2])();
    this_01 = JavascriptFunction::GetFunctionBody
                        ((JavascriptFunction *)CONCAT44(extraout_var,iVar5));
    pSVar10 = FunctionBody::GetScopeObjectChain(this_01);
    if (pSVar10 != (ScopeObjectChain *)0x0) {
      offset = LocalsWalker::GetAdjustedByteCodeOffset((this->super_VariableWalkerBase).pFrame);
      iVar6 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
      alloc = GetArenaFromContext((ScriptContext *)CONCAT44(extraout_var_00,iVar6));
      pLVar11 = (List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
      (pLVar11->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      .buffer = (Type)0x0;
      (pLVar11->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      .count = 0;
      (pLVar11->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      .alloc = alloc;
      (pLVar11->
      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>)
      ._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f9d08;
      pLVar11->length = 0;
      pLVar11->increment = 4;
      this->pDiagScopeObjects = pLVar11;
      pSVar10 = FunctionBody::GetScopeObjectChain(this_01);
      iVar5 = (((pSVar10->pScopeChain).ptr)->
              super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>).count;
      if (-1 < iVar5 + -1) {
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        local_58 = &PTR_Get_014f8760;
        do {
          iVar5 = iVar5 + -1;
          pTVar12 = JsUtil::
                    List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item((pSVar10->pScopeChain).ptr,iVar5);
          this_00 = (RecyclableArrayWalker *)pTVar12->ptr;
          bVar4 = DebuggerScope::IsOffsetInScope((DebuggerScope *)this_00,offset);
          if (((!bVar4) || (bVar4 = DebuggerScope::IsParamScope((DebuggerScope *)this_00), bVar4))
             || ((this_00->indexedItemCount == 0xffffffff &&
                 ((*(Type *)&(this_00->super_RecyclableObjectWalker).instance !=
                   DiagBlockScopeDirect ||
                  (bVar4 = DebuggerScope::HasProperties((DebuggerScope *)this_00), !bVar4))))))
          goto LAB_008bf398;
          switch(*(Type *)&(this_00->super_RecyclableObjectWalker).instance) {
          case DiagWithScope:
            if (this->enumWithScopeAlso == true) {
              this_02 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x38,alloc,0x366bee);
              pDVar1 = (this->super_VariableWalkerBase).pFrame;
              RVar7 = DebuggerScope::GetLocation((DebuggerScope *)this_00);
              iVar8 = (*pDVar1->_vptr_DiagStackFrame[5])(pDVar1,(ulong)RVar7,1);
              RecyclableObjectWalker::RecyclableObjectWalker
                        (this_02,(ScriptContext *)CONCAT44(extraout_var_00,iVar6),
                         (Var)CONCAT44(extraout_var_02,iVar8));
              pLVar11 = this->pDiagScopeObjects;
              JsUtil::
              List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::EnsureArray(pLVar11,0);
              iVar8 = (pLVar11->
                      super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count;
              (pLVar11->
              super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).buffer[iVar8] = (IDiagObjectModelWalkerBase *)this_02;
              (pLVar11->
              super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
              ).count = iVar8 + 1;
              pp_Var15 = (this_02->super_IDiagObjectModelWalkerBase).
                         _vptr_IDiagObjectModelWalkerBase;
              goto LAB_008bf392;
            }
            break;
          case DiagCatchScopeDirect:
          case DiagCatchScopeInObject:
            pIVar13 = (IDiagObjectModelWalkerBase *)new<Memory::ArenaAllocator>(0x18,alloc,0x366bee)
            ;
            pDVar1 = (this->super_VariableWalkerBase).pFrame;
            pIVar13->_vptr_IDiagObjectModelWalkerBase = (_func_int **)&PTR_Get_014f8800;
            pIVar13[1]._vptr_IDiagObjectModelWalkerBase = (_func_int **)pDVar1;
            pIVar13[2]._vptr_IDiagObjectModelWalkerBase = (_func_int **)this_00;
            pLVar11 = this->pDiagScopeObjects;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(pLVar11,0);
            iVar8 = (pLVar11->
                    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (pLVar11->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).buffer[iVar8] = pIVar13;
            (pLVar11->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count = iVar8 + 1;
            iVar8 = *(int *)(pIVar13[2]._vptr_IDiagObjectModelWalkerBase[1] + 0x10);
            goto LAB_008bf395;
          case DiagCatchScopeInSlot:
          case DiagBlockScopeInSlot:
            this_02 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
            pSVar2 = (ScriptContext *)(this->super_VariableWalkerBase).pFrame;
            DebuggerScope::GetLocation((DebuggerScope *)this_00);
            iVar8 = (*(pSVar2->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x12])(pSVar2);
            this_02->scriptContext = pSVar2;
            this_02->instance = (Var)CONCAT44(extraout_var_01,iVar8);
            this_02->originalInstance = (Var)0x0;
            *(undefined4 *)&this_02->pMembersList = 1;
            *(undefined2 *)((long)&this_02->pMembersList + 4) = 0;
            ppuVar14 = &PTR_Get_014f8710;
            goto LAB_008bf35d;
          case DiagBlockScopeDirect:
            this_02 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
            this_02->scriptContext = (ScriptContext *)(this->super_VariableWalkerBase).pFrame;
            this_02->instance = (Var)0x0;
            this_02->originalInstance = (Var)0x0;
            *(undefined4 *)&this_02->pMembersList = 1;
            *(undefined2 *)((long)&this_02->pMembersList + 4) = 0;
            (this_02->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
                 (_func_int **)&PTR_Get_014f86c0;
            this_02->innerArrayObjectWalker = this_00;
            pLVar11 = this->pDiagScopeObjects;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(pLVar11,0);
            iVar8 = (pLVar11->
                    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (pLVar11->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).buffer[iVar8] = (IDiagObjectModelWalkerBase *)this_02;
            (pLVar11->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count = iVar8 + 1;
            pp_Var15 = (this_02->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase;
            goto LAB_008bf392;
          case DiagBlockScopeInObject:
            this_02 = (RecyclableObjectWalker *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
            pSVar2 = (ScriptContext *)(this->super_VariableWalkerBase).pFrame;
            DebuggerScope::GetLocation((DebuggerScope *)this_00);
            iVar8 = (*(pSVar2->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x12])(pSVar2);
            this_02->scriptContext = pSVar2;
            this_02->instance = (Var)CONCAT44(extraout_var_03,iVar8);
            this_02->originalInstance = (Var)0x0;
            *(undefined4 *)&this_02->pMembersList = 1;
            *(undefined2 *)((long)&this_02->pMembersList + 4) = 0;
            ppuVar14 = local_58;
LAB_008bf35d:
            (this_02->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase =
                 (_func_int **)ppuVar14;
            pLVar11 = this->pDiagScopeObjects;
            JsUtil::
            List<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(pLVar11,0);
            iVar8 = (pLVar11->
                    super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (pLVar11->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).buffer[iVar8] = &this_02->super_IDiagObjectModelWalkerBase;
            (pLVar11->
            super_ReadOnlyList<Js::IDiagObjectModelWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
            ).count = iVar8 + 1;
            pp_Var15 = (this_02->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase;
LAB_008bf392:
            iVar8 = (*pp_Var15[1])(this_02);
LAB_008bf395:
            this->diagScopeVarCount = this->diagScopeVarCount + iVar8;
            break;
          default:
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                        ,0x3f0,"(false)","false");
            if (!bVar4) goto LAB_008bf3b7;
            *puVar9 = 0;
          }
LAB_008bf398:
        } while (0 < iVar5);
      }
    }
    this->scopeIsInitialized = true;
  }
  return this->diagScopeVarCount;
}

Assistant:

uint32 DiagScopeVariablesWalker::GetChildrenCount()
    {
        if (scopeIsInitialized)
        {
            return diagScopeVarCount;
        }
        Assert(pFrame);
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();

        if (pFBody->GetScopeObjectChain())
        {
            int bytecodeOffset = GetAdjustedByteCodeOffset();
            ScriptContext * scriptContext = pFrame->GetScriptContext();
            ArenaAllocator *arena = GetArenaFromContext(scriptContext);
            pDiagScopeObjects = JsUtil::List<IDiagObjectModelWalkerBase *, ArenaAllocator>::New(arena);

            // Look for catch/with/block scopes which encompass current offset (skip block scopes as
            // they are only used for lookup within the RegSlotVariablesWalker).

            // Go the reverse way so that we find the innermost scope first;
            Js::ScopeObjectChain * pScopeObjectChain = pFBody->GetScopeObjectChain();
            for (int i = pScopeObjectChain->pScopeChain->Count() - 1 ; i >= 0; i--)
            {
                Js::DebuggerScope *debuggerScope = pScopeObjectChain->pScopeChain->Item(i);
                bool isScopeInRange = debuggerScope->IsOffsetInScope(bytecodeOffset);
                if (isScopeInRange
                    && !debuggerScope->IsParamScope()
                    && (debuggerScope->IsOwnScope() || (debuggerScope->scopeType == DiagBlockScopeDirect && debuggerScope->HasProperties())))
                {
                    switch (debuggerScope->scopeType)
                    {
                    case DiagWithScope:
                        {
                            if (enumWithScopeAlso)
                            {
                                RecyclableObjectWalker* recylableObjectWalker = Anew(arena, RecyclableObjectWalker, scriptContext,
                                    (Var)pFrame->GetRegValue(debuggerScope->GetLocation(), true));
                                pDiagScopeObjects->Add(recylableObjectWalker);
                                diagScopeVarCount += recylableObjectWalker->GetChildrenCount();
                            }
                        }
                        break;
                    case DiagCatchScopeDirect:
                    case DiagCatchScopeInObject:
                        {
                            CatchScopeWalker* catchScopeWalker = Anew(arena, CatchScopeWalker, pFrame, debuggerScope);
                            pDiagScopeObjects->Add(catchScopeWalker);
                            diagScopeVarCount += catchScopeWalker->GetChildrenCount();
                        }
                        break;
                    case DiagCatchScopeInSlot:
                    case DiagBlockScopeInSlot:
                        {
                            SlotArrayVariablesWalker* blockScopeWalker = Anew(arena, SlotArrayVariablesWalker, pFrame,
                                (Var)pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation()), UIGroupType_InnerScope, /* allowLexicalThis */ false);
                            pDiagScopeObjects->Add(blockScopeWalker);
                            diagScopeVarCount += blockScopeWalker->GetChildrenCount();
                        }
                        break;
                    case DiagBlockScopeDirect:
                        {
                            RegSlotVariablesWalker *pObjWalker = Anew(arena, RegSlotVariablesWalker, pFrame, debuggerScope, UIGroupType_InnerScope);
                            pDiagScopeObjects->Add(pObjWalker);
                            diagScopeVarCount += pObjWalker->GetChildrenCount();
                        }
                        break;
                    case DiagBlockScopeInObject:
                        {
                            ObjectVariablesWalker* objectVariablesWalker = Anew(arena, ObjectVariablesWalker, pFrame, pFrame->GetInnerScopeFromRegSlot(debuggerScope->GetLocation()), UIGroupType_InnerScope, /* allowLexicalThis */ false);
                            pDiagScopeObjects->Add(objectVariablesWalker);
                            diagScopeVarCount += objectVariablesWalker->GetChildrenCount();
                        }
                        break;
                    default:
                        Assert(false);
                    }
                }
            }
        }
        scopeIsInitialized = true;
        return diagScopeVarCount;
    }